

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fwPortTest.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  AmpIO *pAVar5;
  ostream *poVar6;
  size_t i;
  undefined1 auVar7 [8];
  uint32_t sdata;
  size_t j;
  long lVar8;
  ulong uVar9;
  long lVar10;
  __suseconds_t *p_Var11;
  timeval local_d48 [99];
  undefined1 *puStack_710;
  undefined1 local_708 [8];
  FirewirePort fwport;
  stringstream debugStream;
  ios_base local_190 [264];
  undefined8 local_88;
  undefined8 uStack_80;
  char local_74 [4];
  double dStack_70;
  char short_options [4];
  undefined1 local_60 [8];
  timeval start;
  pointer ppAStack_48;
  quadlet_t dataQuadlet;
  vector<AmpIO_*,_std::allocator<AmpIO_*>_> BoardList;
  
  ppAStack_48 = (pointer)0x0;
  BoardList.super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  BoardList.super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_88 = 0x300000002;
  uStack_80 = 0x700000006;
  builtin_strncpy(local_74,"hp:",4);
  iVar3 = 0;
  while( true ) {
    while( true ) {
      puStack_710 = (undefined1 *)0x104812;
      iVar2 = getopt(argc,argv,local_74);
      if (iVar2 != 0x68) break;
      puStack_710 = (undefined1 *)0x10481c;
      ShowUsage();
    }
    if (iVar2 == -1) break;
    if (iVar2 != 0x70) {
      puStack_710 = &LAB_00104e28;
      abort();
    }
    puStack_710 = (undefined1 *)0x10483b;
    iVar3 = atoi(_optarg);
    puStack_710 = (undefined1 *)0x104852;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"using port number",0x11);
    puStack_710 = (undefined1 *)0x104867;
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
    puStack_710 = (undefined1 *)0x104872;
    std::ostream::put(-0x68);
    puStack_710 = (undefined1 *)0x10487a;
    std::ostream::flush();
  }
  puStack_710 = (undefined1 *)0x10488d;
  std::__cxx11::stringstream::stringstream((stringstream *)&fwport.old_reset_handler,_S_out|_S_in);
  puStack_710 = (undefined1 *)0x1048a3;
  FirewirePort::FirewirePort((FirewirePort *)local_708,iVar3,(ostream *)&std::cout);
  if (fwport.super_BasePort.Board2Node._24_8_ == 0) {
    puStack_710 = (undefined1 *)0x104da2;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to initialize firewire port",0x22);
    puStack_710 = (undefined1 *)0x104db6;
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
    puStack_710 = (undefined1 *)0x104dc5;
    std::ostream::put(-0x58);
    iVar3 = 1;
    puStack_710 = (undefined1 *)0x104dd2;
    std::ostream::flush();
  }
  else {
    puStack_710 = (undefined1 *)0x1048c9;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Open port on ",0xd);
    puStack_710 = (undefined1 *)0x1048db;
    plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
    puStack_710 = (undefined1 *)0x1048f2;
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    puStack_710 = (undefined1 *)0x1048fd;
    std::ostream::put((char)plVar4);
    puStack_710 = (undefined1 *)0x104905;
    std::ostream::flush();
    lVar8 = 0;
    do {
      puStack_710 = (undefined1 *)0x104919;
      pAVar5 = (AmpIO *)operator_new(0xe58);
      puStack_710 = (undefined1 *)0x10492d;
      AmpIO::AmpIO(pAVar5,(uint8_t)*(undefined4 *)((long)&local_88 + lVar8 * 4));
      puStack_710 = (undefined1 *)0x10493e;
      local_60 = (undefined1  [8])pAVar5;
      std::vector<AmpIO*,std::allocator<AmpIO*>>::emplace_back<AmpIO*>
                ((vector<AmpIO*,std::allocator<AmpIO*>> *)&stack0xffffffffffffffb8,
                 (AmpIO **)local_60);
      puStack_710 = (undefined1 *)0x104952;
      FirewirePort::AddBoard((FirewirePort *)local_708,(BoardIO *)ppAStack_48[lVar8]);
      puStack_710 = (undefined1 *)0x104962;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"new board with node_id = ",0x19);
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
      puStack_710 = (undefined1 *)0x104997;
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      puStack_710 = (undefined1 *)0x1049ae;
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      puStack_710 = (undefined1 *)0x1049b9;
      std::ostream::put((char)poVar6);
      puStack_710 = (undefined1 *)0x1049c1;
      std::ostream::flush();
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    puStack_710 = (undefined1 *)0x1049ee;
    bVar1 = BasePort::WriteQuadlet((BasePort *)local_708,'?',0xffffff000003,0x88380000);
    if (!bVar1) {
      puStack_710 = (undefined1 *)0x104a0d;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Quadlet broadcast error",0x17);
      puStack_710 = (undefined1 *)0x104a21;
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
      puStack_710 = (undefined1 *)0x104a30;
      std::ostream::put(-0x58);
      puStack_710 = (undefined1 *)0x104a38;
      std::ostream::flush();
    }
    if (BoardList.super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>._M_impl.
        super__Vector_impl_data._M_start != ppAStack_48) {
      uVar9 = 0;
      do {
        start.tv_usec._4_4_ = 0;
        puStack_710 = (undefined1 *)0x104a7e;
        BasePort::ReadQuadlet
                  ((BasePort *)local_708,(ppAStack_48[uVar9]->super_FpgaIO).super_BoardIO.BoardId,3,
                   (quadlet_t *)((long)&start.tv_usec + 4));
        *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
        puStack_710 = (undefined1 *)0x104aa3;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Board ",6);
        puStack_710 = (undefined1 *)0x104ab7;
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,
                            (uint)(ppAStack_48[uVar9]->super_FpgaIO).super_BoardIO.BoardId);
        puStack_710 = (undefined1 *)0x104aca;
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," watchdog = ",0xc);
        *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
             *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 8;
        puStack_710 = (undefined1 *)0x104aee;
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        puStack_710 = (undefined1 *)0x104b05;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        puStack_710 = (undefined1 *)0x104b10;
        std::ostream::put((char)poVar6);
        puStack_710 = (undefined1 *)0x104b18;
        std::ostream::flush();
        uVar9 = uVar9 + 1;
      } while (uVar9 < (ulong)((long)BoardList.super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start - (long)ppAStack_48
                              >> 3));
    }
    start.tv_usec._4_4_ = 0;
    if (BoardList.super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>._M_impl.
        super__Vector_impl_data._M_start != ppAStack_48) {
      uVar9 = 0;
      do {
        puStack_710 = (undefined1 *)0x104b52;
        AmpIO::WriteSafetyRelay(ppAStack_48[uVar9],true);
        puStack_710 = (undefined1 *)0x104b64;
        AmpIO::WritePowerEnable(ppAStack_48[uVar9],true);
        puStack_710 = (undefined1 *)0x104b6e;
        usleep(40000);
        puStack_710 = (undefined1 *)0x104b85;
        AmpIO::WriteAmpEnable(ppAStack_48[uVar9],0xf,0xf);
        uVar9 = uVar9 + 1;
      } while (uVar9 < (ulong)((long)BoardList.super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start - (long)ppAStack_48
                              >> 3));
    }
    lVar8 = 0;
    do {
      pAVar5 = ppAStack_48[lVar8];
      sdata = 0x8000;
      lVar10 = 0;
      do {
        puStack_710 = (undefined1 *)0x104bbe;
        AmpIO::SetMotorCurrent(pAVar5,(uint)lVar10,sdata);
        lVar10 = lVar10 + 1;
        sdata = sdata + 0x200;
      } while (lVar10 != 4);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    lVar8 = 0;
    gettimeofday((timeval *)local_60,(__timezone_ptr_t)0x0);
    do {
      BasePort::ReadAllBoardsBroadcast((BasePort *)local_708);
      BasePort::WriteAllBoardsBroadcast((BasePort *)local_708);
      gettimeofday((timeval *)((long)&local_d48[0].tv_sec + lVar8),(__timezone_ptr_t)0x0);
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x640);
    p_Var11 = &local_d48[0].tv_usec;
    lVar8 = 0;
    auVar7 = local_60;
    do {
      pAVar5 = (AmpIO *)((timeval *)(p_Var11 + -1))->tv_sec;
      lVar10 = *p_Var11;
      dStack_70 = (double)((long)pAVar5 - (long)auVar7) * 1000000.0 +
                  (double)(lVar10 - start.tv_sec) + 0.5;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"time ",5);
      poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," = ",3);
      *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(*(long *)poVar6 + -0x18) + 0x18) & 0xffffffb5 | 2;
      poVar6 = std::ostream::_M_insert<double>(dStack_70);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      lVar8 = lVar8 + 1;
      p_Var11 = p_Var11 + 2;
      auVar7 = (undefined1  [8])pAVar5;
      start.tv_sec = lVar10;
    } while (lVar8 != 100);
    if (BoardList.super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>._M_impl.
        super__Vector_impl_data._M_start != ppAStack_48) {
      uVar9 = 0;
      do {
        AmpIO::WriteSafetyRelay(ppAStack_48[uVar9],false);
        AmpIO::WriteAmpEnable(ppAStack_48[uVar9],0xf,0);
        AmpIO::WritePowerEnable(ppAStack_48[uVar9],false);
        FirewirePort::RemoveBoard
                  ((FirewirePort *)local_708,
                   (ppAStack_48[uVar9]->super_FpgaIO).super_BoardIO.BoardId);
        uVar9 = uVar9 + 1;
      } while (uVar9 < (ulong)((long)BoardList.super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start - (long)ppAStack_48
                              >> 3));
    }
    iVar3 = 0;
  }
  puStack_710 = (undefined1 *)0x104dde;
  FirewirePort::~FirewirePort((FirewirePort *)local_708);
  puStack_710 = (undefined1 *)0x104df1;
  std::__cxx11::stringstream::~stringstream((stringstream *)&fwport.old_reset_handler);
  puStack_710 = (undefined1 *)0x104dfd;
  std::ios_base::~ios_base(local_190);
  if (ppAStack_48 != (pointer)0x0) {
    puStack_710 = (undefined1 *)0x104e12;
    operator_delete(ppAStack_48,
                    (long)BoardList.super__Vector_base<AmpIO_*,_std::allocator<AmpIO_*>_>._M_impl.
                          super__Vector_impl_data._M_finish - (long)ppAStack_48);
  }
  return iVar3;
}

Assistant:

int main(int argc, char** argv)
{
    // declare variables and default values
    int port = 0;
    const size_t numBoards = 4;
    int board_id[numBoards] = {BoardIO::MAX_BOARDS, BoardIO::MAX_BOARDS};
    std::vector<AmpIO*> BoardList;

    // set board id
    board_id[0] = 2;
    board_id[1] = 3;
    board_id[2] = 6;
    board_id[3] = 7;

    // command line option setup
    const char short_options[] = "hp:";
    int next_option;
    do {
        next_option = getopt(argc, argv, short_options);
        switch (next_option)
        {
        case 'h':
            ShowUsage();
            break;
        case 'p':
            port = atoi(optarg);
            std::cout << "using port number" << std::endl;
            break;
        case -1:  // parsing done
            break;
        default:  // should NEVER happen
            abort();
        }
    }
    while (next_option != -1);

    // ---------------------------------------------------
    // Firewire port
    // ZC: really this port number should be interactive
    // ---------------------------------------------------
    std::stringstream debugStream(std::stringstream::out|std::stringstream::in);
    FirewirePort fwport(port, std::cout);
    if (!fwport.IsOK()) {
        std::cerr << "Failed to initialize firewire port" << std::endl;
        return EXIT_FAILURE;
    } else {
        std::cout << "Open port on " << port << std::endl;
    }

    // Create AmpIO board 1 and 2
    for (size_t i = 0; i < numBoards; i++) {
        BoardList.push_back(new AmpIO(board_id[i]));
        fwport.AddBoard(BoardList[i]);
        std::cout << "new board with node_id = " << std::dec
                  << fwport.GetNodeId(board_id[i]) << std::endl;
    }

    // ----- ---------------------------------
    // Quadlet broadcast
    // ---------------------------------------
    bool rc;
    nodeaddr_t nodeaddress_wd = 0xffffff000003;
    rc = fwport.WriteQuadlet(FW_NODE_BROADCAST, nodeaddress_wd, bswap_32(0x3888));
    if (!rc) {
        std::cerr << "Quadlet broadcast error" << std::endl;
    }

    // now read back and verify
    quadlet_t dataQuadlet = 0x0000;
    for (size_t i = 0; i < BoardList.size(); i++) {
        fwport.ReadQuadlet(BoardList[i]->GetBoardId(), 0x03, dataQuadlet);
        std::cout << std::dec << "Board " << (int) BoardList[i]->GetBoardId()
                  << " watchdog = " << std::hex << bswap_32(dataQuadlet) << std::endl;
        dataQuadlet = 0x0000; // clear value
    }

    // ----- ---------------------------------
    // Block broadcast
    // --------------------------------------
    for (size_t i = 0; i < BoardList.size(); i++) {
        BoardList[i]->WriteSafetyRelay(true);
        BoardList[i]->WritePowerEnable(true);
        usleep(40000); // sleep 40 ms
        BoardList[i]->WriteAmpEnable(0x0f, 0x0f);
    }

    AmpIO* board;
    for (size_t i = 0; i < numBoards; i++) {
        board = BoardList[i];
        // set current for all boards
        for (size_t j = 0; j < 4; j++) {
            board->SetMotorCurrent(j, 0x8000 + 0x200 * j);
        }
    }

	
    // ----- ---------------------------------
    // Broadcast Write/Read boards
    // ---------------------------------------

    int counter = 0;
    int csize = 100;
    timeval start, prev;
    timeval stop[csize];

    gettimeofday(&start, NULL);
    while(counter < csize){
        counter++;
        fwport.ReadAllBoardsBroadcast();
        fwport.WriteAllBoardsBroadcast();
        gettimeofday(&stop[counter-1], NULL);
    }

    prev = start;
    for (int i = 0; i < csize; i++) {
        double mtime;
        mtime = (stop[i].tv_sec - prev.tv_sec) * 1000000.0 +
                (stop[i].tv_usec - prev.tv_usec) + 0.5;
        prev = stop[i];

        std::cout << "time " << i << " = " << std::dec << mtime << std::endl;
    }


    // Shut down boards and remove from port
    for (size_t i = 0; i < BoardList.size(); i++) {
        BoardList[i]->WriteSafetyRelay(false);
        BoardList[i]->WriteAmpEnable(0x0f, 0);   // Turn power off
        BoardList[i]->WritePowerEnable(false);   // Turn power off
        fwport.RemoveBoard(BoardList[i]->GetBoardId());
    }

    return EXIT_SUCCESS;
}